

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O2

void ZopfliFindLongestMatch
               (ZopfliBlockState *s,ZopfliHash *h,uchar *array,size_t pos,size_t size,size_t limit,
               unsigned_short *sublen,unsigned_short *distance,unsigned_short *length)

{
  char *pcVar1;
  ushort uVar2;
  ushort uVar3;
  unsigned_short uVar4;
  uint uVar5;
  long *plVar6;
  unsigned_short uVar7;
  uint uVar8;
  long *plVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long *plVar14;
  ZopfliLongestMatchCache *lmc;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar21;
  ulong uVar22;
  unsigned_short *puVar23;
  ushort uVar24;
  bool bVar25;
  unsigned_short *local_60;
  int *local_58;
  char *pcVar20;
  
  local_58 = h->head;
  local_60 = h->prev;
  iVar10 = h->val;
  lmc = s->lmc;
  if (lmc == (ZopfliLongestMatchCache *)0x0) {
    lmc = (ZopfliLongestMatchCache *)0x0;
  }
  else {
    sVar21 = pos - s->blockstart;
    uVar11 = (ulong)lmc->length[sVar21];
    if ((uVar11 == 0) || (lmc->dist[sVar21] != 0)) {
      bVar25 = true;
      if ((limit != 0x102) && (limit < uVar11)) {
        if (sublen == (unsigned_short *)0x0) goto LAB_00121242;
        uVar5 = ZopfliMaxCachedSublen(lmc,sVar21,uVar11);
        bVar25 = limit <= uVar5;
        lmc = s->lmc;
      }
      if ((lmc != (ZopfliLongestMatchCache *)0x0) && (bVar25)) {
        if (sublen != (unsigned_short *)0x0) {
          uVar24 = lmc->length[sVar21];
          uVar5 = ZopfliMaxCachedSublen(lmc,sVar21,(ulong)uVar24);
          lmc = s->lmc;
          if (uVar5 < uVar24) {
            limit = (size_t)lmc->length[sVar21];
            goto LAB_00121242;
          }
        }
        uVar24 = (ushort)limit;
        if (lmc->length[sVar21] <= limit) {
          uVar24 = lmc->length[sVar21];
        }
        *length = uVar24;
        if (sublen == (unsigned_short *)0x0) {
          puVar23 = lmc->dist + sVar21;
        }
        else {
          ZopfliCacheToSublen(lmc,sVar21,(ulong)uVar24,sublen);
          puVar23 = sublen + *length;
        }
        *distance = *puVar23;
        return;
      }
    }
  }
LAB_00121242:
  if (size - pos < 3) {
    *length = 0;
    *distance = 0;
  }
  else {
    uVar5 = (uint)pos & 0x7fff;
    uVar11 = size - pos;
    if (limit + pos <= size) {
      uVar11 = limit;
    }
    plVar6 = (long *)(array + pos);
    uVar24 = *(ushort *)(local_58 + iVar10);
    uVar2 = local_60[uVar24];
    uVar8 = (uint)uVar24 - (uint)uVar2;
    uVar15 = uVar8 + 0x8000;
    if ((uint)uVar2 <= (uint)uVar24 && uVar8 != 0) {
      uVar15 = uVar8;
    }
    uVar18 = 1;
    uVar22 = 0;
    uVar8 = 0x2000;
    do {
      uVar16 = (ulong)uVar15;
      uVar17 = (uint)uVar18;
      if (0x7fff < uVar15) break;
      if (uVar15 != 0) {
        plVar9 = (long *)(array + (pos - uVar16));
        uVar19 = uVar18 & 0xffff;
        if ((size <= pos + uVar19) ||
           (*(char *)((long)plVar6 + uVar19) == *(char *)((long)plVar9 + uVar19))) {
          uVar24 = h->same[uVar5];
          plVar14 = plVar6;
          if ((2 < uVar24) && ((char)*plVar6 == (char)*plVar9)) {
            uVar3 = h->same[(uint)(pos - uVar16) & 0x7fff];
            if (uVar3 <= uVar24) {
              uVar24 = uVar3;
            }
            uVar13 = (uint)uVar24;
            if (uVar11 < uVar13) {
              uVar13 = (uint)uVar11;
            }
            plVar9 = (long *)((long)plVar9 + (ulong)(uVar13 & 0xffff));
            plVar14 = (long *)((ulong)(uVar13 & 0xffff) + (long)plVar6);
          }
          for (; (plVar14 < (long *)((uVar11 - 8) + (long)plVar6) && (*plVar14 == *plVar9));
              plVar14 = plVar14 + 1) {
            plVar9 = plVar9 + 1;
          }
          for (lVar12 = 0;
              (pcVar1 = (char *)((long)plVar14 + lVar12), pcVar20 = (char *)((long)plVar6 + uVar11),
              pcVar1 != (char *)((long)plVar6 + uVar11) &&
              (pcVar20 = pcVar1, *pcVar1 == *(char *)((long)plVar9 + lVar12))); lVar12 = lVar12 + 1)
          {
          }
          uVar19 = (long)pcVar20 - (long)plVar6;
          if ((ushort)uVar18 < (ushort)uVar19) {
            if (sublen != (unsigned_short *)0x0) {
              while (uVar17 = uVar17 + 1, (ushort)uVar17 <= (ushort)uVar19) {
                sublen[uVar17 & 0xffff] = (unsigned_short)uVar15;
              }
            }
            uVar18 = uVar19;
            uVar22 = uVar16;
            uVar17 = (uint)uVar19;
            if (uVar11 <= (uVar19 & 0xffff)) break;
          }
        }
      }
      uVar17 = (uint)uVar18;
      if (((local_58 != h->head2) && (h->same[uVar5] <= (ushort)uVar18)) &&
         (h->val2 == h->hashval2[uVar2])) {
        local_60 = h->prev2;
        local_58 = h->head2;
      }
      uVar24 = local_60[uVar2];
      if (uVar24 == uVar2) break;
      iVar10 = ((uint)uVar2 - (uint)uVar24) + 0x8000;
      if (uVar24 < uVar2) {
        iVar10 = (uint)uVar2 - (uint)uVar24;
      }
      uVar15 = uVar15 + iVar10;
      uVar18 = uVar18 & 0xffffffff;
      bVar25 = 1 < uVar8;
      uVar8 = uVar8 - 1;
      uVar2 = uVar24;
    } while (bVar25);
    uVar24 = (ushort)uVar17;
    sVar21 = pos - s->blockstart;
    if (lmc == (ZopfliLongestMatchCache *)0x0) {
      bVar25 = false;
    }
    else if (lmc->length[sVar21] == 0) {
      bVar25 = true;
    }
    else {
      bVar25 = lmc->dist[sVar21] != 0;
    }
    if (((sublen != (unsigned_short *)0x0) && (uVar11 == 0x102)) &&
       ((lmc != (ZopfliLongestMatchCache *)0x0 && (!bVar25)))) {
      uVar7 = (unsigned_short)uVar22;
      if (uVar24 < 3) {
        uVar7 = 0;
      }
      uVar4 = 0;
      if (uVar24 >= 3) {
        uVar4 = uVar24;
      }
      lmc->dist[sVar21] = uVar7;
      lmc->length[sVar21] = uVar4;
      ZopfliSublenToCache(sublen,sVar21,(ulong)(uVar17 & 0xffff),lmc);
    }
    *distance = (unsigned_short)uVar22;
    *length = uVar24;
  }
  return;
}

Assistant:

void ZopfliFindLongestMatch(ZopfliBlockState* s, const ZopfliHash* h,
    const unsigned char* array,
    size_t pos, size_t size, size_t limit,
    unsigned short* sublen, unsigned short* distance, unsigned short* length) {
  unsigned short hpos = pos & ZOPFLI_WINDOW_MASK, p, pp;
  unsigned short bestdist = 0;
  unsigned short bestlength = 1;
  const unsigned char* scan;
  const unsigned char* match;
  const unsigned char* arrayend;
  const unsigned char* arrayend_safe;
#if ZOPFLI_MAX_CHAIN_HITS < ZOPFLI_WINDOW_SIZE
  int chain_counter = ZOPFLI_MAX_CHAIN_HITS;  /* For quitting early. */
#endif

  unsigned dist = 0;  /* Not unsigned short on purpose. */

  int* hhead = h->head;
  unsigned short* hprev = h->prev;
  int* hhashval = h->hashval;
  int hval = h->val;

#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  if (TryGetFromLongestMatchCache(s, pos, &limit, sublen, distance, length)) {
    assert(pos + *length <= size);
    return;
  }
#endif

  assert(limit <= ZOPFLI_MAX_MATCH);
  assert(limit >= ZOPFLI_MIN_MATCH);
  assert(pos < size);

  if (size - pos < ZOPFLI_MIN_MATCH) {
    /* The rest of the code assumes there are at least ZOPFLI_MIN_MATCH bytes to
       try. */
    *length = 0;
    *distance = 0;
    return;
  }

  if (pos + limit > size) {
    limit = size - pos;
  }
  arrayend = &array[pos] + limit;
  arrayend_safe = arrayend - 8;

  assert(hval < 65536);

  pp = hhead[hval];  /* During the whole loop, p == hprev[pp]. */
  p = hprev[pp];

  assert(pp == hpos);

  dist = p < pp ? pp - p : ((ZOPFLI_WINDOW_SIZE - p) + pp);

  /* Go through all distances. */
  while (dist < ZOPFLI_WINDOW_SIZE) {
    unsigned short currentlength = 0;

    assert(p < ZOPFLI_WINDOW_SIZE);
    assert(p == hprev[pp]);
    assert(hhashval[p] == hval);

    if (dist > 0) {
      assert(pos < size);
      assert(dist <= pos);
      scan = &array[pos];
      match = &array[pos - dist];

      /* Testing the byte at position bestlength first, goes slightly faster. */
      if (pos + bestlength >= size
          || *(scan + bestlength) == *(match + bestlength)) {

#ifdef ZOPFLI_HASH_SAME
        unsigned short same0 = h->same[pos & ZOPFLI_WINDOW_MASK];
        if (same0 > 2 && *scan == *match) {
          unsigned short same1 = h->same[(pos - dist) & ZOPFLI_WINDOW_MASK];
          unsigned short same = same0 < same1 ? same0 : same1;
          if (same > limit) same = limit;
          scan += same;
          match += same;
        }
#endif
        scan = GetMatch(scan, match, arrayend, arrayend_safe);
        currentlength = scan - &array[pos];  /* The found length. */
      }

      if (currentlength > bestlength) {
        if (sublen) {
          unsigned short j;
          for (j = bestlength + 1; j <= currentlength; j++) {
            sublen[j] = dist;
          }
        }
        bestdist = dist;
        bestlength = currentlength;
        if (currentlength >= limit) break;
      }
    }


#ifdef ZOPFLI_HASH_SAME_HASH
    /* Switch to the other hash once this will be more efficient. */
    if (hhead != h->head2 && bestlength >= h->same[hpos] &&
        h->val2 == h->hashval2[p]) {
      /* Now use the hash that encodes the length and first byte. */
      hhead = h->head2;
      hprev = h->prev2;
      hhashval = h->hashval2;
      hval = h->val2;
    }
#endif

    pp = p;
    p = hprev[p];
    if (p == pp) break;  /* Uninited prev value. */

    dist += p < pp ? pp - p : ((ZOPFLI_WINDOW_SIZE - p) + pp);

#if ZOPFLI_MAX_CHAIN_HITS < ZOPFLI_WINDOW_SIZE
    chain_counter--;
    if (chain_counter <= 0) break;
#endif
  }

#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  StoreInLongestMatchCache(s, pos, limit, sublen, bestdist, bestlength);
#endif

  assert(bestlength <= limit);

  *distance = bestdist;
  *length = bestlength;
  assert(pos + *length <= size);
}